

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Txa.cpp
# Opt level: O0

int processTxa(istream *in,path *output)

{
  Size size;
  bool bVar1;
  TxaHeader *in_RDI;
  path outFilename;
  Image currentChunk;
  string outName;
  TxaChunk *chunk;
  iterator __end1;
  iterator __begin1;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *__range1;
  ThreadedImageSaver saver;
  TxaHeader header;
  string outTemplate;
  path outputDir;
  TxaHeader *in_stack_fffffffffffffd38;
  path *in_stack_fffffffffffffd40;
  uint in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  ThreadedImageSaver *this;
  undefined4 in_stack_fffffffffffffd68;
  Color in_stack_fffffffffffffd6c;
  int in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  uint32_t in_stack_fffffffffffffd78;
  uint32_t in_stack_fffffffffffffd7c;
  ThreadedImageSaver *in_stack_fffffffffffffd80;
  path *in_stack_fffffffffffffd88;
  istream *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  string local_250 [116];
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  string local_1b0 [32];
  path local_190;
  TxaChunk *local_168;
  __normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_> local_160;
  undefined1 *local_158;
  undefined1 local_c0 [184];
  TxaHeader *local_8;
  
  local_8 = in_RDI;
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::stem(in_stack_fffffffffffffd88);
  std::filesystem::__cxx11::path::string
            ((path *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd40);
  this = (ThreadedImageSaver *)local_c0;
  TxaHeader::TxaHeader((TxaHeader *)0x12f539);
  operator>>((istream *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  ThreadedImageSaver::ThreadedImageSaver(in_stack_fffffffffffffd80);
  local_158 = local_c0 + 0x18;
  local_160._M_current =
       (TxaChunk *)
       std::vector<TxaChunk,_std::allocator<TxaChunk>_>::begin
                 ((vector<TxaChunk,_std::allocator<TxaChunk>_> *)in_stack_fffffffffffffd38);
  local_168 = (TxaChunk *)
              std::vector<TxaChunk,_std::allocator<TxaChunk>_>::end
                        ((vector<TxaChunk,_std::allocator<TxaChunk>_> *)in_stack_fffffffffffffd38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
                        *)in_stack_fffffffffffffd40,
                       (__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
                        *)in_stack_fffffffffffffd38);
    if (!bVar1) break;
    local_190._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )__gnu_cxx::
           __normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>::
           operator*(&local_160);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),(char *)this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   &in_stack_fffffffffffffd40->_M_pathname);
    std::__cxx11::string::~string(local_1b0);
    local_1d8 = 0;
    uStack_1d4 = 0;
    local_1dc = 0;
    size.height = in_stack_fffffffffffffd74;
    size.width = in_stack_fffffffffffffd70;
    Image::Image((Image *)this,size,in_stack_fffffffffffffd6c);
    in_stack_fffffffffffffd48 = local_c0[0] & 1;
    in_stack_fffffffffffffd40 = &local_190;
    in_stack_fffffffffffffd38 = local_8;
    processChunkNoHeader
              ((Image *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
               in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,
               (int)in_stack_fffffffffffffd6c,in_stack_fffffffffffffd90,in_stack_fffffffffffffd98,
               SUB41((uint)in_stack_fffffffffffffd68 >> 0x18,0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),(char *)this);
    std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd38);
    std::filesystem::__cxx11::operator/
              ((path *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),(path *)this);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd40);
    std::__cxx11::string::~string(local_250);
    Image::Image((Image *)in_stack_fffffffffffffd40,(Image *)in_stack_fffffffffffffd38);
    std::filesystem::__cxx11::path::path
              (in_stack_fffffffffffffd40,(path *)in_stack_fffffffffffffd38);
    ThreadedImageSaver::enqueue
              ((ThreadedImageSaver *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (Image *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),(path *)this);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd40);
    Image::~Image((Image *)0x12f773);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd40);
    Image::~Image((Image *)0x12f78d);
    std::__cxx11::string::~string((string *)&local_190);
    __gnu_cxx::__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>::
    operator++(&local_160);
  }
  ThreadedImageSaver::~ThreadedImageSaver(this);
  TxaHeader::~TxaHeader((TxaHeader *)0x12f920);
  std::__cxx11::string::~string((string *)(local_c0 + 0x68));
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffd40);
  return 0;
}

Assistant:

int processTxa(std::istream &in, const fs::path &output) {
	fs::path outputDir = output.parent_path();
	std::string outTemplate = output.stem().string();

	TxaHeader header;
	in >> header;

#if ENABLE_MULTITHREADED
	ThreadedImageSaver saver;
#endif

	for (const auto& chunk : header.chunks) {
		std::string outName = outTemplate + "_" + chunk.name;
		Image currentChunk({0, 0});
		processChunkNoHeader(currentChunk, chunk.offset, chunk.length, header.indexed, chunk.width, chunk.height, in, outName, header.isSwitch);

		auto outFilename = outputDir/fs::u8path(outName + ".png");
#if ENABLE_MULTITHREADED
		saver.enqueue(std::move(currentChunk), std::move(outFilename));
#else
		currentChunk.writePNG(outFilename);
#endif
	}
	return 0;
}